

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

lbool __thiscall Minisat::Solver::solve_(Solver *this)

{
  vec<Minisat::lbool> *this_00;
  bool bVar1;
  int i;
  uint64_t uVar2;
  ulong uVar3;
  long lVar4;
  undefined8 *puVar5;
  int seq;
  int iVar6;
  int pre_conflict_size;
  int iVar7;
  int *nof_conflicts_00;
  char *__s;
  uint uVar8;
  double dVar9;
  lbool status;
  int nof_conflicts;
  int weighted;
  int init;
  vec<Minisat::Lit> *local_48;
  vector<char,_std::allocator<char>_> *local_40;
  double local_38;
  
  if ((this->model).data != (lbool *)0x0) {
    (this->model).sz = 0;
  }
  if ((this->conflict).data != (Lit *)0x0) {
    (this->conflict).sz = 0;
  }
  status.value = '\x01';
  if (this->ok == true) {
    reset_old_trail(this);
    this->solves = this->solves + 1;
    this->solve_starts = (int)this->starts;
    local_38 = cpuTime();
    this->systematic_branching_state = 1;
    this->max_learnts = (double)(this->clauses).sz * this->learntsize_factor;
    this->learntsize_adjust_confl = (double)this->learntsize_adjust_start_confl;
    this->learntsize_adjust_cnt = this->learntsize_adjust_start_confl;
    status.value = '\x02';
    local_40 = &this->ls_mediation_soln;
    std::vector<char,_std::allocator<char>_>::resize(local_40,(long)(this->vardata).sz);
    std::vector<char,_std::allocator<char>_>::resize(&this->ls_best_soln,(long)(this->vardata).sz);
    std::vector<char,_std::allocator<char>_>::resize(&this->top_trail_soln,(long)(this->vardata).sz)
    ;
    if (0 < this->verbosity) {
      puts("c ============================[ Search Statistics ]==============================");
      puts("c | Conflicts |          ORIGINAL         |          LEARNT          | Progress |");
      puts("c |           |    Vars  Clauses Literals |    Limit  Clauses Lit/Cl |          |");
      puts("c ===============================================================================");
    }
    if ((this->add_tmp).data != (Lit *)0x0) {
      (this->add_tmp).sz = 0;
    }
    iVar6 = (this->assumptions).sz;
    if (0 < iVar6) {
      this->solved_by_ls = false;
    }
    if (((this->sls_var_lim != -1) && (this->sls_var_lim < (this->vardata).sz)) ||
       ((this->sls_clause_lim != -1 && (this->sls_clause_lim < (this->clauses).sz)))) {
      this->use_ccnr = false;
    }
    uVar2 = this->solves;
    if (uVar2 == 1 && iVar6 == 0) {
      if (this->initial_sls == true) {
        bVar1 = call_ls(this,false);
        if (bVar1) {
          status.value = '\0';
        }
      }
      uVar2 = this->solves;
    }
    if (uVar2 == 1) {
      if (VSIDS_DISTANCE < this->current_heuristic) {
        toggle_decision_heuristic(this,true);
      }
      init = (int)this->VSIDS_props_init_limit;
      while( true ) {
        iVar6 = init;
        bVar1 = lbool::operator==(&status,(lbool)0x2);
        if ((!bVar1) || (iVar6 < 1)) break;
        bVar1 = withinBudget(this);
        if (!bVar1) break;
        status = search(this,&init);
      }
      toggle_decision_heuristic(this,false);
    }
    this_00 = &this->model;
    local_48 = &this->conflict;
    this->last_switch_conflicts = (int)this->starts;
    uVar8 = 0;
    uVar2 = 0;
    while( true ) {
      bVar1 = lbool::operator==(&status,(lbool)0x2);
      if (!bVar1) break;
      bVar1 = withinBudget(this);
      if (!bVar1) break;
      uVar3 = this->VSIDS_props_limit;
      if (uVar3 < this->propagations - uVar2) {
        this->switch_mode = true;
        this->VSIDS_props_limit = uVar3 / 10 + uVar3;
        uVar2 = this->propagations;
      }
      if (this->current_heuristic < CHB) {
        weighted = 0x7fffffff;
        nof_conflicts_00 = &weighted;
      }
      else {
        iVar6 = 0;
        for (iVar7 = 1; iVar7 <= (int)uVar8; iVar7 = iVar7 * 2 + 1) {
          iVar6 = iVar6 + 1;
        }
        uVar3 = (ulong)uVar8;
        while( true ) {
          if (iVar7 + -1 == (int)uVar3) break;
          iVar7 = iVar7 + -1 >> 1;
          iVar6 = iVar6 + -1;
          uVar3 = (long)(int)uVar3 % (long)iVar7 & 0xffffffff;
        }
        dVar9 = pow(this->restart_inc,(double)iVar6);
        nof_conflicts = (int)((double)this->restart_first * dVar9);
        uVar8 = uVar8 + 1;
        nof_conflicts_00 = &nof_conflicts;
      }
      status = search(this,nof_conflicts_00);
      if (this->switch_heristic_mod < this->starts - (long)this->last_switch_conflicts) {
        this->switch_mode = false;
        toggle_decision_heuristic(this,VSIDS_DISTANCE < this->current_heuristic);
        if (1 < this->verbosity) {
          __s = "c Switched to LRB/DISTANCE.";
          if (this->current_heuristic < CHB) {
            __s = "c Switched to VSIDS.";
          }
          puts(__s);
        }
      }
    }
    if (0 < this->verbosity) {
      puts("c ===============================================================================");
    }
    if (this->drup_file != (FILE *)0x0) {
      bVar1 = lbool::operator==(&status,(lbool)0x1);
      if (bVar1) {
        binDRUP_flush(this,this->drup_file);
      }
    }
    bVar1 = lbool::operator==(&status,(lbool)0x0);
    if (bVar1) {
      vec<Minisat::lbool>::growTo(this_00,(this->vardata).sz);
      if (this->solved_by_ls == true) {
        for (lVar4 = 0; lVar4 < (this->vardata).sz; lVar4 = lVar4 + 1) {
          this_00->data[lVar4].value =
               (local_40->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar4] == '\0';
        }
      }
      else {
        for (lVar4 = 0; lVar4 < (this->vardata).sz; lVar4 = lVar4 + 1) {
          (this->model).data[lVar4].value = (this->assigns).data[lVar4].value;
        }
      }
      if ((this->check_satisfiability == true) && (this->check_satisfiability_simplified == false))
      {
        bVar1 = SATchecker::checkModel(&this->satChecker,this_00);
        if (!bVar1) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = "ERROR: detected model that does not satisfy input formula, abort";
          __cxa_throw(puVar5,&char_const*::typeinfo,0);
        }
        if (this->verbosity != 0) {
          puts("c validated SAT answer");
        }
      }
    }
    else {
      bVar1 = lbool::operator==(&status,(lbool)0x1);
      if ((bVar1) && ((this->conflict).sz == 0)) {
        this->ok = false;
      }
    }
    cancelUntil(this,0,false);
    bVar1 = lbool::operator==(&status,(lbool)0x1);
    if (((bVar1) && (iVar6 = (this->conflict).sz, iVar6 != 0)) && (this->lcm_core == true)) {
      bVar1 = true;
      if (this->lcm_core_success == true) {
        simplifyLearnt<Minisat::vec<Minisat::Lit>>(this,local_48);
        bVar1 = (this->conflict).sz < iVar6;
      }
      this->lcm_core_success = bVar1;
    }
    this->systematic_branching_state = 0;
    dVar9 = cpuTime();
    (this->statistics).solveSeconds = (dVar9 - local_38) + (this->statistics).solveSeconds;
  }
  return (lbool)status.value;
}

Assistant:

lbool Solver::solve_()
{
    model.clear();
    conflict.clear();
    if (!ok) return l_False;

    reset_old_trail();
    solves++;
    solve_starts = starts;
    TRACE(std::cout << "c start " << solves << " solve call with " << clauses.size() << " clauses and " << nVars()
                    << " variables" << std::endl);

    double solve_start = cpuTime();
    systematic_branching_state = 1;

    max_learnts = nClauses() * learntsize_factor;
    learntsize_adjust_confl = learntsize_adjust_start_confl;
    learntsize_adjust_cnt = (int)learntsize_adjust_confl;
    lbool status = l_Undef;

    ls_mediation_soln.resize(nVars());
    ls_best_soln.resize(nVars());
    top_trail_soln.resize(nVars());

    if (verbosity >= 1) {
        printf("c ============================[ Search Statistics ]==============================\n");
        printf("c | Conflicts |          ORIGINAL         |          LEARNT          | Progress |\n");
        printf("c |           |    Vars  Clauses Literals |    Limit  Clauses Lit/Cl |          |\n");
        printf("c ===============================================================================\n");
    }

    add_tmp.clear();

    /* disable a potential SLS solution in case of solving with assumptions */
    if (assumptions.size() > 0) solved_by_ls = false;

    /* allow to disable SLS for larger clauses */
    if ((sls_var_lim != -1 && nVars() > sls_var_lim) || (sls_clause_lim != -1 && nClauses() > sls_clause_lim)) {
        use_ccnr = false;
    }

    /* do not start with SLS, in case we have assumptions, or solve incrementally */
    if (assumptions.size() == 0 && solves == 1 && initial_sls) {
        int fls_res = call_ls(false);
        if (fls_res) {
            status = l_True;
        }
    }

    // toggle back to VSIDS, in case we run the initialization here
    if (solves == 1) {
        if (!usesVSIDS()) toggle_decision_heuristic(true);
        int init = VSIDS_props_init_limit;
        while (status == l_Undef && init > 0 && withinBudget()) status = search(init);
        // do not use VSIDS now
        toggle_decision_heuristic(false);
    }

    // Search:
    uint64_t curr_props = 0;
    int curr_restarts = 0;
    last_switch_conflicts = starts;
    while (status == l_Undef && withinBudget()) {
        if (propagations - curr_props > VSIDS_props_limit) {
            curr_props = propagations;
            switch_mode = true;
            VSIDS_props_limit = VSIDS_props_limit + VSIDS_props_limit / 10;
        }
        if (usesVSIDS()) {
            int weighted = INT32_MAX;
            status = search(weighted);
        } else {
            int nof_conflicts = luby(restart_inc, curr_restarts) * restart_first;
            curr_restarts++;
            status = search(nof_conflicts);
        }

        // toggle VSIDS?
        // if (switch_mode) {
        if (starts - last_switch_conflicts > switch_heristic_mod) {
            switch_mode = false;
            toggle_decision_heuristic(!usesVSIDS()); // switch to VSIDS
            if (verbosity >= 1) {
                if (usesVSIDS()) {
                    if (verbosity > 1) printf("c Switched to VSIDS.\n");
                } else {
                    if (verbosity > 1) printf("c Switched to LRB/DISTANCE.\n");
                }
            }
        }
    }

    TRACE(check_invariants();)

    if (verbosity >= 1) printf("c ===============================================================================\n");

#ifdef BIN_DRUP
    if (drup_file && status == l_False) binDRUP_flush(drup_file);
#endif

    if (status == l_True) {
        // Extend & copy model:
        model.growTo(nVars());
        if (solved_by_ls)
            for (int i = 0; i < nVars(); i++) model[i] = ls_mediation_soln[i] ? l_True : l_False;
        else
            for (int i = 0; i < nVars(); i++) model[i] = value(i);

        if (check_satisfiability && !check_satisfiability_simplified) {
            if (!satChecker.checkModel(model)) {
                assert(false && "model should satisfy full input formula");
                throw("ERROR: detected model that does not satisfy input formula, abort");
                exit(1);
            } else if (verbosity)
                printf("c validated SAT answer\n");
        }

    } else if (status == l_False && conflict.size() == 0)
        ok = false;

    cancelUntil(0);

    if (status == l_False && conflict.size() && lcm_core) {
        if (lcm_core_success) {
            int pre_conflict_size = conflict.size();
            simplifyLearnt(conflict);
            lcm_core_success = pre_conflict_size > conflict.size();
        } else
            lcm_core_success = true;
    }

    systematic_branching_state = 0;
    statistics.solveSeconds += cpuTime() - solve_start; // stop timer and record time consumed until now

    return status;
}